

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O1

char * save_settings(char *section,Conf *conf)

{
  char *in_RAX;
  settings_w *sesskey;
  char *errmsg;
  char *local_18;
  
  local_18 = in_RAX;
  sesskey = open_settings_w(section,&local_18);
  if (sesskey != (settings_w *)0x0) {
    save_open_settings(sesskey,conf);
    close_settings_w(sesskey);
    local_18 = (char *)0x0;
  }
  return local_18;
}

Assistant:

char *save_settings(const char *section, Conf *conf)
{
    struct settings_w *sesskey;
    char *errmsg;

    sesskey = open_settings_w(section, &errmsg);
    if (!sesskey)
        return errmsg;
    save_open_settings(sesskey, conf);
    close_settings_w(sesskey);
    return NULL;
}